

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::metricToString_abi_cxx11_(Args *this,metric_name mn)

{
  undefined4 in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> *in_stack_ffffffffffffffb0;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15 [21];
  
  pbVar1 = in_RDI;
  switch(in_EDX) {
  case 1:
    __a = local_15;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_29);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar1,(char *)in_RDI,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_2a);
  }
  return pbVar1;
}

Assistant:

std::string Args::metricToString(metric_name mn) const {
  switch (mn) {
    case metric_name::f1score:
      return "f1score";
    case metric_name::f1scoreLabel:
      return "f1scoreLabel";
    case metric_name::precisionAtRecall:
      return "precisionAtRecall";
    case metric_name::precisionAtRecallLabel:
      return "precisionAtRecallLabel";
    case metric_name::recallAtPrecision:
      return "recallAtPrecision";
    case metric_name::recallAtPrecisionLabel:
      return "recallAtPrecisionLabel";
  }
  return "Unknown metric name!"; // should never happen
}